

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O1

void __thiscall
SolverTest_OptionHeader_Test::TestBody()::OptionTestSolver::~OptionTestSolver
          (OptionTestSolver *this)

{
  void *pvVar1;
  
  *(undefined ***)(this + -0x80) = &PTR__Solver_0028adb8;
  *(undefined ***)(this + -0x78) = &PTR__Solver_0028ae28;
  *(undefined ***)(this + -0x60) = &PTR__Solver_0028ae50;
  *(undefined ***)(this + -0x58) = &PTR__Solver_0028ae80;
  *(undefined ***)this = &PTR__Solver_0028aea0;
  pvVar1 = *(void **)(this + 0x268);
  if (pvVar1 != (void *)0x0) {
    operator_delete(pvVar1,*(long *)(this + 0x278) - (long)pvVar1);
  }
  mp::BasicSolver::~BasicSolver((BasicSolver *)(this + -0x80));
  return;
}

Assistant:

TEST(SolverTest, OptionHeader) {
  struct OptionTestSolver : Solver {
    OptionTestSolver() : Solver("testsolver", 0, 0, 0) {}
    void set_option_header() {
      Solver::set_option_header("test header");
    }
    int DoSolve(Problem &, SolutionHandler &) { return 0; }
    void ReadNL(fmt::StringRef) {}
  } s;
  EXPECT_STREQ("", s.option_header());
  s.set_option_header();
  EXPECT_STREQ("test header", s.option_header());
}